

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O3

void terminate(int signum)

{
  undefined4 in_register_0000003c;
  
  gpioTerminate(CONCAT44(in_register_0000003c,signum));
  fwrite("SIGHUP/SIGTERM received\n",0x18,1,(FILE *)errFifo);
  fflush((FILE *)0x0);
  fclose((FILE *)errFifo);
  unlink("/dev/pigerr");
  exit(0);
}

Assistant:

void terminate(int signum)
{
   /* only registered for SIGHUP/SIGTERM */

   gpioTerminate();

   fprintf(errFifo, "SIGHUP/SIGTERM received\n");

   fflush(NULL);

   fclose(errFifo);

   unlink(PI_ERRFIFO);

   exit(0);
}